

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderNaive.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::ssc::SscReaderNaive::GetDeferred
          (SscReaderNaive *this,VariableBase *variable,void *data)

{
  pointer pBVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  mapped_type *pmVar4;
  long lVar5;
  size_t **ppsVar6;
  size_t *psVar7;
  size_t *psVar8;
  BlockInfo *b;
  pointer pBVar9;
  uint8_t *puVar10;
  size_t sVar11;
  BlockInfo *b_1;
  CoreDims local_4b0;
  CoreDims local_4a0;
  CoreDims local_490;
  CoreDims local_480;
  DimsArray vStart;
  DimsArray vMemStart;
  DimsArray vCount;
  DimsArray vMemCount;
  
  if (*(int *)(variable + 0x28) == 0xe) {
    lVar3 = __dynamic_cast(variable,&VariableBase::typeinfo,
                           &Variable<std::__cxx11::string>::typeinfo,0);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->m_BlockMap,(key_type *)(variable + 8));
    pBVar9 = (pmVar4->
             super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (pmVar4->
             super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar9 != pBVar1) {
      do {
        __n = (pBVar9->name)._M_string_length;
        if ((__n == *(size_t *)(variable + 0x10)) &&
           ((__n == 0 ||
            (iVar2 = bcmp((pBVar9->name)._M_dataplus._M_p,
                          (((key_type *)(variable + 8))->_M_dataplus)._M_p,__n), iVar2 == 0)))) {
          puVar10 = (this->super_SscReaderBase).m_Buffer.m_Buffer + pBVar9->bufferStart;
          vStart.super_CoreDims.DimCount = (size_t)vStart.Dimensions;
          std::__cxx11::string::_M_construct<unsigned_char*>
                    ((string *)&vStart,puVar10,puVar10 + pBVar9->bufferCount);
          std::__cxx11::string::operator=((string *)data,(string *)&vStart);
          if ((size_t *)vStart.super_CoreDims.DimCount != vStart.Dimensions) {
            operator_delete((void *)vStart.super_CoreDims.DimCount);
          }
          std::__cxx11::string::_M_assign((string *)(lVar3 + 0x268));
          std::__cxx11::string::_M_assign((string *)(lVar3 + 0x228));
          std::__cxx11::string::_M_assign((string *)(lVar3 + 0x248));
        }
        pBVar9 = pBVar9 + 1;
      } while (pBVar9 != pBVar1);
    }
  }
  else {
    lVar3 = *(long *)(variable + 0x70);
    lVar5 = *(long *)(variable + 0x78);
    sVar11 = lVar5 - lVar3 >> 3;
    vStart.super_CoreDims.DimensSpan = vStart.Dimensions;
    vStart.super_CoreDims.DimCount = sVar11;
    memset(vStart.super_CoreDims.DimensSpan,0,0x100);
    if (lVar5 != lVar3) {
      lVar5 = 0;
      do {
        vStart.Dimensions[lVar5] = *(size_t *)(lVar3 + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (sVar11 + (sVar11 == 0) != lVar5);
    }
    lVar3 = *(long *)(variable + 0x88);
    lVar5 = *(long *)(variable + 0x90);
    sVar11 = lVar5 - lVar3 >> 3;
    vCount.super_CoreDims.DimensSpan = vCount.Dimensions;
    vCount.super_CoreDims.DimCount = sVar11;
    memset(vCount.super_CoreDims.DimensSpan,0,0x100);
    if (lVar5 != lVar3) {
      lVar5 = 0;
      do {
        vCount.Dimensions[lVar5] = *(size_t *)(lVar3 + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (sVar11 + (sVar11 == 0) != lVar5);
    }
    lVar3 = *(long *)(variable + 0xa0);
    lVar5 = *(long *)(variable + 0xa8);
    sVar11 = lVar5 - lVar3 >> 3;
    vMemStart.super_CoreDims.DimensSpan = vMemStart.Dimensions;
    vMemStart.super_CoreDims.DimCount = sVar11;
    memset(vMemStart.super_CoreDims.DimensSpan,0,0x100);
    if (lVar5 != lVar3) {
      lVar5 = 0;
      do {
        vMemStart.Dimensions[lVar5] = *(size_t *)(lVar3 + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (sVar11 + (sVar11 == 0) != lVar5);
    }
    lVar3 = *(long *)(variable + 0xb8);
    lVar5 = *(long *)(variable + 0xc0);
    sVar11 = lVar5 - lVar3 >> 3;
    psVar8 = vMemCount.Dimensions;
    vMemCount.super_CoreDims.DimCount = sVar11;
    vMemCount.super_CoreDims.DimensSpan = psVar8;
    memset(psVar8,0,0x100);
    if (lVar5 != lVar3) {
      lVar5 = 0;
      do {
        vMemCount.Dimensions[lVar5] = *(size_t *)(lVar3 + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (sVar11 + (sVar11 == 0) != lVar5);
    }
    if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
      ppsVar6 = (size_t **)(vStart.Dimensions + (vStart.super_CoreDims.DimCount - 1));
      if (vStart.Dimensions < ppsVar6 && vStart.super_CoreDims.DimCount != 0) {
        psVar7 = vStart.Dimensions;
        do {
          psVar7 = psVar7 + 1;
          sVar11 = psVar7[-1];
          psVar7[-1] = (size_t)*ppsVar6;
          *ppsVar6 = (size_t *)sVar11;
          ppsVar6 = ppsVar6 + -1;
        } while (psVar7 < ppsVar6);
      }
      ppsVar6 = (size_t **)(vCount.Dimensions + (vCount.super_CoreDims.DimCount - 1));
      if (vCount.Dimensions < ppsVar6 && vCount.super_CoreDims.DimCount != 0) {
        psVar7 = vCount.Dimensions;
        do {
          psVar7 = psVar7 + 1;
          sVar11 = psVar7[-1];
          psVar7[-1] = (size_t)*ppsVar6;
          *ppsVar6 = (size_t *)sVar11;
          ppsVar6 = ppsVar6 + -1;
        } while (psVar7 < ppsVar6);
      }
      ppsVar6 = (size_t **)(vMemStart.Dimensions + (vMemStart.super_CoreDims.DimCount - 1));
      if (vMemStart.Dimensions < ppsVar6 && vMemStart.super_CoreDims.DimCount != 0) {
        psVar7 = vMemStart.Dimensions;
        do {
          psVar7 = psVar7 + 1;
          sVar11 = psVar7[-1];
          psVar7[-1] = (size_t)*ppsVar6;
          *ppsVar6 = (size_t *)sVar11;
          ppsVar6 = ppsVar6 + -1;
        } while (psVar7 < ppsVar6);
      }
      ppsVar6 = (size_t **)(vMemCount.Dimensions + (vMemCount.super_CoreDims.DimCount - 1));
      if (psVar8 < ppsVar6 && vMemCount.super_CoreDims.DimCount != 0) {
        psVar8 = vMemCount.Dimensions;
        do {
          psVar8 = psVar8 + 1;
          sVar11 = psVar8[-1];
          psVar8[-1] = (size_t)*ppsVar6;
          *ppsVar6 = (size_t *)sVar11;
          ppsVar6 = ppsVar6 + -1;
        } while (psVar8 < ppsVar6);
      }
    }
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->m_BlockMap,(key_type *)(variable + 8));
    pBVar1 = (pmVar4->
             super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar9 = (pmVar4->
                  super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start; pBVar9 != pBVar1; pBVar9 = pBVar9 + 1)
    {
      switch(pBVar9->shapeId) {
      case GlobalValue:
      case LocalValue:
        memcpy(data,(this->super_SscReaderBase).m_Buffer.m_Buffer + pBVar9->bufferStart,
               pBVar9->bufferCount);
        break;
      case GlobalArray:
      case LocalArray:
        local_4a0.DimensSpan =
             (pBVar9->start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_4a0.DimCount =
             (long)(pBVar9->start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)local_4a0.DimensSpan >> 3;
        local_4b0.DimensSpan =
             (pBVar9->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_4b0.DimCount =
             (long)(pBVar9->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)local_4b0.DimensSpan >> 3;
        local_490.DimCount = local_4b0.DimCount;
        local_490.DimensSpan = local_4b0.DimensSpan;
        local_480.DimCount = local_4a0.DimCount;
        local_480.DimensSpan = local_4a0.DimensSpan;
        adios2::helper::NdCopy
                  ((char *)((this->super_SscReaderBase).m_Buffer.m_Buffer + pBVar9->bufferStart),
                   &local_480,&local_490,true,true,(char *)data,&vStart.super_CoreDims,
                   &vCount.super_CoreDims,true,true,*(int *)(variable + 0x30),&local_4a0,&local_4b0,
                   &vMemStart.super_CoreDims,&vMemCount.super_CoreDims,false,Host,false);
      }
    }
  }
  return;
}

Assistant:

void SscReaderNaive::GetDeferred(VariableBase &variable, void *data)
{

    if (variable.m_Type == DataType::String)
    {
        auto *variableString = dynamic_cast<Variable<std::string> *>(&variable);
        auto *dataString = reinterpret_cast<std::string *>(data);
        for (const auto &b : m_BlockMap[variable.m_Name])
        {
            if (b.name == variable.m_Name)
            {
                *dataString = std::string(m_Buffer.data() + b.bufferStart,
                                          m_Buffer.data() + b.bufferStart + b.bufferCount);
                variableString->m_Value = *dataString;
                variableString->m_Min = *dataString;
                variableString->m_Max = *dataString;
            }
        }
        return;
    }

    helper::DimsArray vStart(variable.m_Start);
    helper::DimsArray vCount(variable.m_Count);
    helper::DimsArray vMemStart(variable.m_MemoryStart);
    helper::DimsArray vMemCount(variable.m_MemoryCount);

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    for (const auto &b : m_BlockMap[variable.m_Name])
    {
        if (b.shapeId == ShapeID::GlobalArray || b.shapeId == ShapeID::LocalArray)
        {
            helper::NdCopy(m_Buffer.data<char>() + b.bufferStart, helper::CoreDims(b.start),
                           helper::CoreDims(b.count), true, true, reinterpret_cast<char *>(data),
                           vStart, vCount, true, true, static_cast<int>(variable.m_ElementSize),
                           helper::CoreDims(b.start), helper::CoreDims(b.count), vMemStart,
                           vMemCount);
        }
        else if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
        {
            std::memcpy(data, m_Buffer.data() + b.bufferStart, b.bufferCount);
        }
    }
}